

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::Throw_USE_NotFound(X3DImporter *this,string *pAttrValue)

{
  undefined8 *puVar1;
  int iVar2;
  runtime_error *this_00;
  long *plVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  allocator<char> local_d1;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Not found node with name \"",pAttrValue);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (ulong *)*plVar3;
  puVar5 = (ulong *)(plVar3 + 2);
  if (local_b0 == puVar5) {
    local_a0 = *puVar5;
    uStack_98 = (undefined4)plVar3[3];
    uStack_94 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar5;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  iVar2 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,(char *)CONCAT44(extraout_var,iVar2),&local_d1);
  uVar7 = 0xf;
  if (local_b0 != &local_a0) {
    uVar7 = local_a0;
  }
  if (uVar7 < (ulong)(local_88 + local_a8)) {
    uVar7 = 0xf;
    if (local_90 != local_80) {
      uVar7 = local_80[0];
    }
    if ((ulong)(local_88 + local_a8) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_0063b54b;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
LAB_0063b54b:
  local_d0 = (undefined8 *)*puVar4;
  puVar1 = puVar4 + 2;
  if (local_d0 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar4[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar1;
  }
  local_c8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_70 = (long *)*plVar3;
  plVar6 = plVar3 + 2;
  if (local_70 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_70);
  *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void X3DImporter::Throw_USE_NotFound(const std::string& pAttrValue)
{
	throw DeadlyImportError("Not found node with name \"" + pAttrValue + "\" in <" + std::string(mReader->getNodeName()) + ">.");
}